

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAllocator.h
# Opt level: O0

BitTrie * __thiscall
slang::PoolAllocator<slang::ast::BitTrie,_72UL,_8UL>::emplace<slang::ast::BitTrie>
          (PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> *this)

{
  PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> *in_RDI;
  BitTrie *mem;
  BitTrie *local_20;
  size_t in_stack_fffffffffffffff0;
  
  if (in_RDI->freeList == (FreeNode *)0x0) {
    local_20 = (BitTrie *)
               BumpAllocator::allocate
                         ((BumpAllocator *)in_RDI,in_stack_fffffffffffffff0,(size_t)in_RDI);
  }
  else {
    local_20 = (BitTrie *)pop(in_RDI);
  }
  memset(local_20,0,0x48);
  ast::BitTrie::BitTrie(local_20);
  return local_20;
}

Assistant:

TSubClass* emplace(Args&&... args) {
        static_assert(sizeof(TSubClass) <= Size);
        static_assert(alignof(TSubClass) <= Align);
        static_assert(std::is_trivially_destructible_v<TSubClass>);
        auto mem = freeList ? reinterpret_cast<TSubClass*>(pop())
                            : reinterpret_cast<TSubClass*>(alloc.allocate(Size, Align));
        return new (mem) TSubClass(std::forward<Args>(args)...);
    }